

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O1

void __thiscall
HDWallet_CheckInvalidMnemonicTest_Test::~HDWallet_CheckInvalidMnemonicTest_Test
          (HDWallet_CheckInvalidMnemonicTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HDWallet, CheckInvalidMnemonicTest) {
  // check empty mnemonic
  EXPECT_FALSE(HDWallet::CheckValidMnemonic(empty_mnemonic, language));

  // check invalid mnemonic
  EXPECT_FALSE(HDWallet::CheckValidMnemonic(invalid_words_mnemonic, language));

  try {
    EXPECT_THROW(HDWallet::CheckValidMnemonic(bip39_test_vectors[0].mnemonic, "zz"), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Not support language passed.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }
}